

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDtdPtr xmlSAXParseDTD(xmlSAXHandlerPtr sax,xmlChar *ExternalID,xmlChar *SystemID)

{
  resolveEntitySAXFunc p_Var1;
  uchar *in;
  int iVar2;
  xmlCharEncoding enc;
  xmlParserCtxtPtr ctxt;
  xmlChar *pxVar3;
  xmlParserInputPtr input;
  xmlDocPtr pxVar4;
  xmlDtdPtr pxVar5;
  _xmlNode *p_Var6;
  _xmlDtd *p_Var7;
  
  if (ExternalID == (xmlChar *)0x0 && SystemID == (xmlChar *)0x0) {
    return (xmlDtdPtr)0x0;
  }
  ctxt = xmlNewSAXParserCtxt(sax,(void *)0x0);
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return (xmlDtdPtr)0x0;
  }
  *(byte *)&ctxt->options = (byte)ctxt->options | 4;
  pxVar3 = xmlCanonicPath(SystemID);
  if (pxVar3 == (xmlChar *)0x0 && SystemID != (xmlChar *)0x0) {
LAB_00165ac1:
    xmlFreeParserCtxt(ctxt);
    return (xmlDtdPtr)0x0;
  }
  if ((ctxt->sax == (_xmlSAXHandler *)0x0) ||
     (p_Var1 = ctxt->sax->resolveEntity, p_Var1 == (resolveEntitySAXFunc)0x0)) {
    input = (xmlParserInputPtr)0x0;
  }
  else {
    input = (*p_Var1)(ctxt->userData,ExternalID,pxVar3);
  }
  if ((input == (xmlParserInputPtr)0x0) || (iVar2 = xmlPushInput(ctxt,input), iVar2 < 0)) {
    xmlFreeParserCtxt(ctxt);
    if (pxVar3 == (xmlChar *)0x0) {
      return (xmlDtdPtr)0x0;
    }
    (*xmlFree)(pxVar3);
    return (xmlDtdPtr)0x0;
  }
  in = ctxt->input->cur;
  if (3 < (long)ctxt->input->end - (long)in) {
    enc = xmlDetectCharEncoding(in,4);
    xmlSwitchEncoding(ctxt,enc);
  }
  if (input->filename == (char *)0x0) {
    input->filename = (char *)pxVar3;
  }
  else {
    (*xmlFree)(pxVar3);
  }
  input->line = 1;
  input->col = 1;
  pxVar3 = ctxt->input->cur;
  input->base = pxVar3;
  input->cur = pxVar3;
  input->free = (xmlParserInputDeallocate)0x0;
  ctxt->inSubset = 2;
  pxVar4 = xmlNewDoc("1.0");
  ctxt->myDoc = pxVar4;
  if (pxVar4 == (xmlDocPtr)0x0) {
    xmlErrMemory(ctxt,"New Doc failed");
    goto LAB_00165ac1;
  }
  pxVar4->properties = 0x40;
  pxVar5 = xmlNewDtd(pxVar4,(xmlChar *)"none",ExternalID,SystemID);
  ctxt->myDoc->extSubset = pxVar5;
  xmlParseExternalSubset(ctxt,ExternalID,SystemID);
  pxVar4 = ctxt->myDoc;
  if (pxVar4 == (xmlDocPtr)0x0) {
    p_Var7 = (_xmlDtd *)0x0;
    goto LAB_00165c56;
  }
  if (ctxt->wellFormed == 0) {
LAB_00165c41:
    p_Var7 = (_xmlDtd *)0x0;
  }
  else {
    p_Var7 = pxVar4->extSubset;
    pxVar4->extSubset = (_xmlDtd *)0x0;
    if (p_Var7 == (_xmlDtd *)0x0) goto LAB_00165c41;
    p_Var7->doc = (_xmlDoc *)0x0;
    for (p_Var6 = p_Var7->children; p_Var6 != (_xmlNode *)0x0; p_Var6 = p_Var6->next) {
      p_Var6->doc = (_xmlDoc *)0x0;
    }
  }
  xmlFreeDoc(pxVar4);
  ctxt->myDoc = (xmlDocPtr)0x0;
LAB_00165c56:
  xmlFreeParserCtxt(ctxt);
  return p_Var7;
}

Assistant:

xmlDtdPtr
xmlSAXParseDTD(xmlSAXHandlerPtr sax, const xmlChar *ExternalID,
                          const xmlChar *SystemID) {
    xmlDtdPtr ret = NULL;
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input = NULL;
    xmlCharEncoding enc;
    xmlChar* systemIdCanonic;

    if ((ExternalID == NULL) && (SystemID == NULL)) return(NULL);

    ctxt = xmlNewSAXParserCtxt(sax, NULL);
    if (ctxt == NULL) {
	return(NULL);
    }

    /* We are loading a DTD */
    ctxt->options |= XML_PARSE_DTDLOAD;

    /*
     * Canonicalise the system ID
     */
    systemIdCanonic = xmlCanonicPath(SystemID);
    if ((SystemID != NULL) && (systemIdCanonic == NULL)) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }

    /*
     * Ask the Entity resolver to load the damn thing
     */

    if ((ctxt->sax != NULL) && (ctxt->sax->resolveEntity != NULL))
	input = ctxt->sax->resolveEntity(ctxt->userData, ExternalID,
	                                 systemIdCanonic);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }

    /*
     * plug some encoding conversion routines here.
     */
    if (xmlPushInput(ctxt, input) < 0) {
	xmlFreeParserCtxt(ctxt);
	if (systemIdCanonic != NULL)
	    xmlFree(systemIdCanonic);
	return(NULL);
    }
    if ((ctxt->input->end - ctxt->input->cur) >= 4) {
	enc = xmlDetectCharEncoding(ctxt->input->cur, 4);
	xmlSwitchEncoding(ctxt, enc);
    }

    if (input->filename == NULL)
	input->filename = (char *) systemIdCanonic;
    else
	xmlFree(systemIdCanonic);
    input->line = 1;
    input->col = 1;
    input->base = ctxt->input->cur;
    input->cur = ctxt->input->cur;
    input->free = NULL;

    /*
     * let's parse that entity knowing it's an external subset.
     */
    ctxt->inSubset = 2;
    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
	xmlErrMemory(ctxt, "New Doc failed");
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
	                               ExternalID, SystemID);
    xmlParseExternalSubset(ctxt, ExternalID, SystemID);

    if (ctxt->myDoc != NULL) {
	if (ctxt->wellFormed) {
	    ret = ctxt->myDoc->extSubset;
	    ctxt->myDoc->extSubset = NULL;
	    if (ret != NULL) {
		xmlNodePtr tmp;

		ret->doc = NULL;
		tmp = ret->children;
		while (tmp != NULL) {
		    tmp->doc = NULL;
		    tmp = tmp->next;
		}
	    }
	} else {
	    ret = NULL;
	}
        xmlFreeDoc(ctxt->myDoc);
        ctxt->myDoc = NULL;
    }
    xmlFreeParserCtxt(ctxt);

    return(ret);
}